

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O1

SUNErrCode N_VBufPack(N_Vector x,void *buf)

{
  SUNErrCode SVar1;
  
  SVar1 = (*x->ops->nvbufpack)(x,buf);
  return SVar1;
}

Assistant:

SUNErrCode N_VBufPack(N_Vector x, void* buf)
{
  SUNFunctionBegin(x->sunctx);
  SUNErrCode ier = SUN_SUCCESS;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(x));
  SUNAssert(x->ops->nvbufpack, SUN_ERR_NOT_IMPLEMENTED);
  ier = x->ops->nvbufpack(x, buf);
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(x));
  return (ier);
}